

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_helpers.hpp
# Opt level: O2

void sdglib::read_flat_vectorvector<ReadMapping>
               (ifstream *ifs,
               vector<std::vector<ReadMapping,_std::allocator<ReadMapping>_>,_std::allocator<std::vector<ReadMapping,_std::allocator<ReadMapping>_>_>_>
               *vv)

{
  pointer pvVar1;
  vector<ReadMapping,_std::allocator<ReadMapping>_> *v;
  pointer v_00;
  uint64_t count;
  
  std::istream::read((char *)ifs,(long)&count);
  std::
  vector<std::vector<ReadMapping,_std::allocator<ReadMapping>_>,_std::allocator<std::vector<ReadMapping,_std::allocator<ReadMapping>_>_>_>
  ::resize(vv,count);
  if (count != 0) {
    pvVar1 = (vv->
             super__Vector_base<std::vector<ReadMapping,_std::allocator<ReadMapping>_>,_std::allocator<std::vector<ReadMapping,_std::allocator<ReadMapping>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    for (v_00 = (vv->
                super__Vector_base<std::vector<ReadMapping,_std::allocator<ReadMapping>_>,_std::allocator<std::vector<ReadMapping,_std::allocator<ReadMapping>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start; v_00 != pvVar1; v_00 = v_00 + 1) {
      read_flat_vector<ReadMapping>(ifs,v_00);
    }
  }
  return;
}

Assistant:

inline void read_flat_vectorvector(std::ifstream &ifs, std::vector<std::vector<T>> &vv) {
        uint64_t count;
        ifs.read(reinterpret_cast<char *>(&count),sizeof(count));
        vv.resize(count);
        if (count > 0) for (auto &v:vv) read_flat_vector<T>(ifs,v);
    }